

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

void __thiscall tiger::trains::world::Market::Market(Market *this,PostModel *model,World *world)

{
  int iVar1;
  
  BasePost::BasePost(&this->super_BasePost,model,world);
  (this->super_BasePost).super_IPost._vptr_IPost = (_func_int **)&PTR__BasePost_0019a9b0;
  iVar1 = models::PostModel::getProduct(model);
  this->product = iVar1;
  iVar1 = models::PostModel::getReplenishment(model);
  this->replenishment = iVar1;
  iVar1 = models::PostModel::getProductCapacity(model);
  this->productCapacity = iVar1;
  return;
}

Assistant:

Market::Market(const models::PostModel &model, World *world)
    : BasePost(model, world)
{
    product = model.getProduct();
    replenishment = model.getReplenishment();
    productCapacity = model.getProductCapacity();
}